

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

void Abc_SclWriteSurface(Vec_Str_t *vOut,SC_Surface *p)

{
  Vec_Flt_t *p_00;
  int iVar1;
  int i;
  long lVar2;
  float fVar3;
  
  Vec_StrPutI(vOut,(p->vIndex0).nSize);
  for (iVar1 = 0; iVar1 < (p->vIndex0).nSize; iVar1 = iVar1 + 1) {
    fVar3 = Vec_FltEntry(&p->vIndex0,iVar1);
    Vec_StrPutF(vOut,fVar3);
  }
  Vec_StrPutI(vOut,(p->vIndex1).nSize);
  for (iVar1 = 0; iVar1 < (p->vIndex1).nSize; iVar1 = iVar1 + 1) {
    fVar3 = Vec_FltEntry(&p->vIndex1,iVar1);
    Vec_StrPutF(vOut,fVar3);
  }
  for (iVar1 = 0; iVar1 < (p->vData).nSize; iVar1 = iVar1 + 1) {
    p_00 = (Vec_Flt_t *)Vec_PtrEntry(&p->vData,iVar1);
    for (i = 0; i < p_00->nSize; i = i + 1) {
      fVar3 = Vec_FltEntry(p_00,i);
      Vec_StrPutF(vOut,fVar3);
    }
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    Vec_StrPutF(vOut,p->approx[0][lVar2]);
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    Vec_StrPutF(vOut,p->approx[1][lVar2]);
  }
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    Vec_StrPutF(vOut,p->approx[2][lVar2]);
  }
  return;
}

Assistant:

static void Abc_SclWriteSurface( Vec_Str_t * vOut, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    float Entry;
    int i, k;

    Vec_StrPutI( vOut, Vec_FltSize(&p->vIndex0) );
    Vec_FltForEachEntry( &p->vIndex0, Entry, i )
        Vec_StrPutF( vOut, Entry );

    Vec_StrPutI( vOut, Vec_FltSize(&p->vIndex1) );
    Vec_FltForEachEntry( &p->vIndex1, Entry, i )
        Vec_StrPutF( vOut, Entry );

    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vVec, i )
        Vec_FltForEachEntry( vVec, Entry, k )
            Vec_StrPutF( vOut, Entry );

    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF( vOut, p->approx[0][i] );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF( vOut, p->approx[1][i] );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF( vOut, p->approx[2][i] );
}